

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void FBehavior::StaticStartTypedScripts
               (WORD type,AActor *activator,bool always,int arg1,bool runNow)

{
  char *pcVar1;
  undefined6 in_register_0000003a;
  uint i;
  ulong uVar2;
  
  uVar2 = CONCAT62(in_register_0000003a,type) & 0xffffffff;
  if ((ushort)uVar2 < 0x10) {
    pcVar1 = _ZZN9FBehavior23StaticStartTypedScriptsEtP6AActorbibE9TypeNames_rel +
             *(int *)(_ZZN9FBehavior23StaticStartTypedScriptsEtP6AActorbibE9TypeNames_rel +
                     (ulong)type * 4);
  }
  else {
    pcVar1 = "Unknown";
  }
  DPrintf(3,"Starting all scripts of type %d (%s)\n",uVar2,pcVar1);
  for (uVar2 = 0; uVar2 < StaticModules.Count; uVar2 = uVar2 + 1) {
    StartTypedScripts(StaticModules.Array[uVar2],type,activator,always,arg1,runNow);
  }
  return;
}

Assistant:

void FBehavior::StaticStartTypedScripts (WORD type, AActor *activator, bool always, int arg1, bool runNow)
{
	static const char *const TypeNames[] =
	{
		"Closed",
		"Open",
		"Respawn",
		"Death",
		"Enter",
		"Pickup",
		"BlueReturn",
		"RedReturn",
		"WhiteReturn",
		"Unknown", "Unknown", "Unknown",
		"Lightning",
		"Unloading",
		"Disconnect",
		"Return"
	};
	DPrintf(DMSG_NOTIFY, "Starting all scripts of type %d (%s)\n", type,
		type < countof(TypeNames) ? TypeNames[type] : TypeNames[SCRIPT_Lightning - 1]);
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		StaticModules[i]->StartTypedScripts (type, activator, always, arg1, runNow);
	}
}